

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsc.c
# Opt level: O1

bsc_step_t
bsc_allgather_single(bsc_step_t depends,bsc_group_t group,void *src,void *dst,bsc_size_t size)

{
  uint uVar1;
  bsp_pid_t bVar2;
  request_t *prVar3;
  bsp_pid_t bVar4;
  ulong uVar5;
  
  if (group == (bsc_group_t)0x0) {
    uVar1 = bsp_nprocs();
  }
  else {
    uVar1 = *group;
  }
  if (0 < (int)uVar1) {
    uVar5 = 0;
    do {
      if (group == (bsc_group_t)0x0) {
        bVar4 = (bsp_pid_t)uVar5;
      }
      else {
        bVar4 = *(bsp_pid_t *)(*(long *)((long)group + 0x10) + uVar5 * 4);
      }
      bVar2 = bsp_pid();
      prVar3 = new_request(depends);
      prVar3->kind = GET;
      (prVar3->payload).put.src_addr = src;
      (prVar3->payload).put.dst_addr = dst;
      (prVar3->payload).put.src_pid = bVar4;
      (prVar3->payload).put.dst_pid = bVar2;
      (prVar3->payload).put.size = size;
      (prVar3->payload).put.offset = 0;
      uVar5 = uVar5 + 1;
      dst = (void *)((long)dst + (long)size);
    } while (uVar1 != uVar5);
  }
  return depends + 1;
}

Assistant:

bsc_step_t bsc_allgather_single( bsc_step_t depends, bsc_group_t group,
                        const void * src, void * dst, bsc_size_t size )
{
    const group_t * g = group;
    bsc_pid_t i, P = g?g->size:bsp_nprocs() ;
    for ( i = 0; i < P; ++i ) {
        char * dst_bytes = dst;
        bsc_get( depends, g?g->gid[i]:i, src, 0, dst_bytes + i * size, size );
    }
    return depends + 1;
}